

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall soplex::CLUFactor<double>::remaxCol(CLUFactor<double> *this,int p_col,int len)

{
  Dring *pDVar1;
  int iVar2;
  int iVar3;
  Dring *pDVar4;
  Dring *pDVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    iVar9 = len - (this->u).col.max[p_col];
    if ((this->u).col.size - (this->u).col.used < iVar9) {
      packColumns(this);
      iVar2 = (this->u).col.size;
      iVar3 = (this->u).col.used;
      iVar9 = len - (this->u).col.max[p_col];
      if (((double)iVar2 < (double)len + (double)iVar3 * this->colMemMult) &&
         (iVar3 = len + iVar3 * 2, iVar2 < iVar3)) {
        (this->u).col.size = iVar3;
        spx_realloc<int*>(&(this->u).col.idx,iVar3);
      }
    }
    piVar8 = &(this->u).col.used;
    *piVar8 = *piVar8 + iVar9;
    (this->u).col.max[p_col] = len;
  }
  else {
    if ((this->u).col.size - (this->u).col.used < len) {
      packColumns(this);
      iVar9 = (this->u).col.size;
      iVar2 = (this->u).col.used;
      if (((double)iVar9 < (double)len + (double)iVar2 * this->colMemMult) &&
         (iVar2 = len + iVar2 * 2, iVar9 < iVar2)) {
        (this->u).col.size = iVar2;
        spx_realloc<int*>(&(this->u).col.idx,iVar2);
      }
    }
    iVar9 = (this->u).col.used;
    piVar8 = (this->u).col.start;
    iVar2 = piVar8[p_col];
    lVar7 = (long)iVar2;
    iVar3 = (this->u).col.len[p_col];
    piVar8[p_col] = iVar9;
    piVar8 = &(this->u).col.used;
    *piVar8 = *piVar8 + len;
    piVar8 = (this->u).col.max;
    pDVar1 = (this->u).col.elem + p_col;
    piVar8[pDVar1->prev->idx] = piVar8[pDVar1->prev->idx] + piVar8[p_col];
    piVar8[p_col] = len;
    pDVar4 = pDVar1->next;
    pDVar4->prev = pDVar1->prev;
    pDVar1->prev->next = pDVar4;
    pDVar4 = (this->u).col.list.prev;
    pDVar5 = pDVar4->next;
    pDVar1->next = pDVar5;
    pDVar5->prev = pDVar1;
    pDVar1->prev = pDVar4;
    pDVar4->next = pDVar1;
    if (0 < iVar3) {
      piVar6 = (this->u).col.idx;
      piVar8 = piVar6 + iVar9;
      do {
        *piVar8 = piVar6[lVar7];
        lVar7 = lVar7 + 1;
        piVar8 = piVar8 + 1;
      } while (lVar7 < iVar3 + iVar2);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}